

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 jsonHexToInt4(char *z)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char *in_RDI;
  u32 v;
  
  bVar1 = jsonHexToInt((int)*in_RDI);
  bVar2 = jsonHexToInt((int)in_RDI[1]);
  bVar3 = jsonHexToInt((int)in_RDI[2]);
  bVar4 = jsonHexToInt((int)in_RDI[3]);
  return (uint)bVar1 * 0x1000 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10 + (uint)bVar4;
}

Assistant:

static u32 jsonHexToInt4(const char *z){
  u32 v;
  v = (jsonHexToInt(z[0])<<12)
    + (jsonHexToInt(z[1])<<8)
    + (jsonHexToInt(z[2])<<4)
    + jsonHexToInt(z[3]);
  return v;
}